

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O1

void __thiscall ON_Sun::LoadFromXMLNode(ON_Sun *this,ON_XMLNode *node)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  tm *ptVar5;
  ON_XMLParameters p;
  time_t time;
  ON_XMLParameters OStack_228;
  ON_XMLVariant local_218;
  ON_XMLVariant local_120;
  double local_28;
  
  ON_XMLParameters::ON_XMLParameters(&OStack_228,node);
  local_218._vptr_ON_XMLVariant = (_func_int **)ON_SecondsSinceJanOne1970UTC();
  ptVar5 = localtime((time_t *)&local_218);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,ptVar5->tm_year + 0x76c);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"year",&local_120);
  uVar2 = ::ON_XMLVariant::AsInteger(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,3);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"month",&local_120);
  uVar3 = ::ON_XMLVariant::AsInteger(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,0x15);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"day",&local_120);
  uVar4 = ::ON_XMLVariant::AsInteger(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,12.0);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"time",&local_120);
  local_28 = ::ON_XMLVariant::AsDouble(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  (*this->_vptr_ON_Sun[0x20])(local_28,this,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,false);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"enable-allowed",&local_120);
  ::ON_XMLVariant::operator_cast_to_bool(&local_218);
  (*this->_vptr_ON_Sun[0x14])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,false);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"enable-on",&local_120);
  ::ON_XMLVariant::operator_cast_to_bool(&local_218);
  (*this->_vptr_ON_Sun[0x15])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,false);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"manual-control-allowed",&local_120);
  ::ON_XMLVariant::operator_cast_to_bool(&local_218);
  (*this->_vptr_ON_Sun[0x16])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,false);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"manual-control-on",&local_120);
  bVar1 = ::ON_XMLVariant::operator_cast_to_bool(&local_218);
  (*this->_vptr_ON_Sun[0x17])(this,(ulong)bVar1);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,90.0);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"north",&local_120);
  ::ON_XMLVariant::operator_cast_to_double(&local_218);
  (*this->_vptr_ON_Sun[0x18])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,0.0);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"sun-azimuth",&local_120);
  ::ON_XMLVariant::operator_cast_to_double(&local_218);
  (*this->_vptr_ON_Sun[0x19])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,0.0);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"sun-altitude",&local_120);
  ::ON_XMLVariant::operator_cast_to_double(&local_218);
  (*this->_vptr_ON_Sun[0x1a])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,false);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"daylight-saving-on",&local_120);
  ::ON_XMLVariant::operator_cast_to_bool(&local_218);
  (*this->_vptr_ON_Sun[0x1e])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,0);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"daylight-saving-minutes",&local_120);
  uVar2 = ::ON_XMLVariant::operator_cast_to_int(&local_218);
  (*this->_vptr_ON_Sun[0x1f])(this,(ulong)uVar2);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,0.0);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"observer-latitude",&local_120);
  ::ON_XMLVariant::operator_cast_to_double(&local_218);
  (*this->_vptr_ON_Sun[0x1b])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,0.0);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"observer-longitude",&local_120);
  ::ON_XMLVariant::operator_cast_to_double(&local_218);
  (*this->_vptr_ON_Sun[0x1c])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,0);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"observer-timezone",&local_120);
  ::ON_XMLVariant::operator_cast_to_double(&local_218);
  (*this->_vptr_ON_Sun[0x1d])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,1.0);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"shadow-intensity",&local_120);
  ::ON_XMLVariant::operator_cast_to_double(&local_218);
  (*this->_vptr_ON_Sun[0x21])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ::ON_XMLVariant::ON_XMLVariant(&local_120,1.0);
  ON_XMLParameters::GetParam(&local_218,&OStack_228,L"intensity",&local_120);
  ::ON_XMLVariant::operator_cast_to_double(&local_218);
  (*this->_vptr_ON_Sun[0x22])(this);
  ::ON_XMLVariant::~ON_XMLVariant(&local_218);
  ::ON_XMLVariant::~ON_XMLVariant(&local_120);
  ON_XMLParameters::~ON_XMLParameters(&OStack_228);
  return;
}

Assistant:

void ON_Sun::LoadFromXMLNode(const ON_XMLNode& node)
{
  ON_XMLParameters p(node);

  int dy = 0, dm = 0, dd = 0; double dh = 0.0;
  ON_SunEngine::GetDefaultLocalDateTime(dy, dm, dd, dh);

  const auto y = p.GetParam(ON_RDK_SUN_DATE_YEAR,  dy).AsInteger();
  const auto m = p.GetParam(ON_RDK_SUN_DATE_MONTH, dm).AsInteger();
  const auto d = p.GetParam(ON_RDK_SUN_DATE_DAY,   dd).AsInteger();
  const auto h = p.GetParam(ON_RDK_SUN_TIME_HOURS, dh).AsDouble();
  SetLocalDateTime(y, m, d, h);

  SetEnableAllowed        (p.GetParam(ON_RDK_SUN_ENABLE_ALLOWED, false));
  SetEnableOn             (p.GetParam(ON_RDK_SUN_ENABLE_ON, false));
  SetManualControlAllowed (p.GetParam(ON_RDK_SUN_MANUAL_CONTROL_ALLOWED, false));
  SetManualControlOn      (p.GetParam(ON_RDK_SUN_MANUAL_CONTROL_ON, false));
  SetNorth                (p.GetParam(ON_RDK_SUN_NORTH, 90.0));
  SetAzimuth              (p.GetParam(ON_RDK_SUN_AZIMUTH, 0.0));
  SetAltitude             (p.GetParam(ON_RDK_SUN_ALTITUDE, 0.0));
  SetDaylightSavingOn     (p.GetParam(ON_RDK_SUN_DAYLIGHT_SAVING_ON, false));
  SetDaylightSavingMinutes(p.GetParam(ON_RDK_SUN_DAYLIGHT_SAVING_MINUTES, 0));
  SetLatitude             (p.GetParam(ON_RDK_SUN_OBSERVER_LATITUDE, 0.0));
  SetLongitude            (p.GetParam(ON_RDK_SUN_OBSERVER_LONGITUDE, 0.0));
  SetTimeZone             (p.GetParam(ON_RDK_SUN_OBSERVER_TIMEZONE, 0));
  SetShadowIntensity      (p.GetParam(ON_RDK_SUN_SHADOW_INTENSITY, 1.0));
  SetIntensity            (p.GetParam(ON_RDK_SUN_INTENSITY, 1.0));
}